

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index segment,
          uint32_t offset,uint32_t size)

{
  Result RVar1;
  
  PrintDetails(this,"   - %d: D <%.*s>",index,name._M_len,name._M_str);
  if ((flags & 0x10) == 0) {
    if ((flags >> 9 & 1) == 0) {
      PrintDetails(this," segment=%u offset=%d size=%d",(ulong)segment,(ulong)offset,(ulong)size);
    }
    else {
      PrintDetails(this," address=%d size=%d",(ulong)offset,(ulong)size);
    }
  }
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnDataSymbol(Index index,
                                         uint32_t flags,
                                         std::string_view name,
                                         Index segment,
                                         uint32_t offset,
                                         uint32_t size) {
  PrintDetails("   - %d: D <" PRIstringview ">", index,
               WABT_PRINTF_STRING_VIEW_ARG(name));
  if (!(flags & WABT_SYMBOL_FLAG_UNDEFINED)) {
    if (flags & WABT_SYMBOL_FLAG_ABS) {
      PrintDetails(" address=%d size=%d", offset, size);
    } else {
      PrintDetails(" segment=%" PRIindex " offset=%d size=%d", segment, offset,
                   size);
    }
  }
  return PrintSymbolFlags(flags);
}